

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptExpression(HlslGrammar *this,TIntermTyped **node)

{
  bool bVar1;
  TIntermTyped *pTVar2;
  TIntermTyped *local_40;
  TIntermTyped *rightNode;
  TSourceLoc loc;
  TIntermTyped **node_local;
  HlslGrammar *this_local;
  
  *node = (TIntermTyped *)0x0;
  loc._16_8_ = node;
  bVar1 = acceptAssignmentExpression(this,node);
  if (bVar1) {
    bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokComma);
    if (bVar1) {
      do {
        rightNode = (TIntermTyped *)(this->super_HlslTokenStream).token.loc.name;
        loc.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
        loc.string = (this->super_HlslTokenStream).token.loc.column;
        loc.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
        HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
        local_40 = (TIntermTyped *)0x0;
        bVar1 = acceptAssignmentExpression(this,&local_40);
        if (!bVar1) {
          expected(this,"assignment expression");
          return false;
        }
        pTVar2 = TIntermediate::addComma
                           (this->intermediate,*(TIntermTyped **)loc._16_8_,local_40,
                            (TSourceLoc *)&rightNode);
        *(TIntermTyped **)loc._16_8_ = pTVar2;
        bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokComma);
      } while (bVar1);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptExpression(TIntermTyped*& node)
{
    node = nullptr;

    // assignment_expression
    if (! acceptAssignmentExpression(node))
        return false;

    if (! peekTokenClass(EHTokComma))
        return true;

    do {
        // ... COMMA
        TSourceLoc loc = token.loc;
        advanceToken();

        // ... assignment_expression
        TIntermTyped* rightNode = nullptr;
        if (! acceptAssignmentExpression(rightNode)) {
            expected("assignment expression");
            return false;
        }

        node = intermediate.addComma(node, rightNode, loc);

        if (! peekTokenClass(EHTokComma))
            return true;
    } while (true);
}